

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O1

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::tryToOptimizeConstant
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this,Expression *oneSide
          ,Expression *otherSide)

{
  Load *pLVar1;
  bool bVar2;
  ulong uVar3;
  address64_t aVar4;
  Literal local_40;
  
  if (oneSide->_id != ConstId) {
    return false;
  }
  Literal::Literal(&local_40,(Literal *)(oneSide + 1));
  uVar3 = Literal::getInteger(&local_40);
  if (uVar3 < 0x400) {
    aVar4 = uVar3 + (this->curr->offset).addr;
    bVar2 = true;
    if (aVar4 < 0x400) goto LAB_007e0d89;
  }
  bVar2 = false;
  aVar4 = 0;
LAB_007e0d89:
  Literal::~Literal(&local_40);
  if (!bVar2) {
    return false;
  }
  pLVar1 = this->curr;
  (pLVar1->offset).addr = aVar4;
  pLVar1->ptr = otherSide;
  if (otherSide->_id == ConstId) {
    optimizeConstantPointer(this);
    return true;
  }
  return true;
}

Assistant:

bool tryToOptimizeConstant(Expression* oneSide, Expression* otherSide) {
    if (auto* c = oneSide->dynCast<Const>()) {
      auto result = canOptimizeConstant(c->value);
      if (result.succeeded) {
        curr->offset = result.total;
        curr->ptr = otherSide;
        if (curr->ptr->template is<Const>()) {
          optimizeConstantPointer();
        }
        return true;
      }
    }
    return false;
  }